

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O3

void ASDCP::TimedText::DescriptorDump(TimedTextDescriptor *TDesc,FILE *stream)

{
  _List_node_base *p_Var1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  char buf [64];
  _List_node_base *local_8f;
  _List_node_base *p_Stack_87;
  char local_78 [72];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  local_8f = *(_List_node_base **)TDesc->AssetID;
  p_Stack_87 = *(_List_node_base **)(TDesc->AssetID + 8);
  fprintf((FILE *)stream,"              EditRate: %u/%u\n",(ulong)(uint)(TDesc->EditRate).Numerator,
          (ulong)(uint)(TDesc->EditRate).Denominator,in_R8,in_R9,&PTR__IArchive_00222020,1);
  fprintf((FILE *)stream,"     ContainerDuration: %u\n",(ulong)TDesc->ContainerDuration);
  uVar2 = Kumu::bin2UUIDhex((uchar *)&local_8f,0x10,local_78,0x40);
  fprintf((FILE *)stream,"               AssetID: %s\n",uVar2);
  fprintf((FILE *)stream,"         NamespaceName: %s\n",(TDesc->NamespaceName)._M_dataplus._M_p);
  fprintf((FILE *)stream,"         ResourceCount: %zu\n",
          (TDesc->ResourceList).
          super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
          ._M_impl._M_node._M_size);
  fprintf((FILE *)stream,"RFC5646LanguageTagList: %s\n",
          (TDesc->RFC5646LanguageTagList)._M_dataplus._M_p);
  for (p_Var1 = (TDesc->ResourceList).
                super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&TDesc->ResourceList; p_Var1 = p_Var1->_M_next) {
    local_8f = p_Var1[1]._M_next;
    p_Stack_87 = p_Var1[1]._M_prev;
    uVar2 = Kumu::bin2UUIDhex((uchar *)&local_8f,0x10,local_78,0x40);
    pcVar3 = "application/x-font-opentype";
    if (*(int *)&p_Var1[2]._M_next != 2) {
      pcVar3 = "application/octet-stream";
    }
    if (*(int *)&p_Var1[2]._M_next == 1) {
      pcVar3 = "image/png";
    }
    fprintf((FILE *)stream,"    %s: %s\n",uVar2,pcVar3);
  }
  return;
}

Assistant:

void
ASDCP::TimedText::DescriptorDump(ASDCP::TimedText::TimedTextDescriptor const& TDesc, FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  UUID TmpID(TDesc.AssetID);
  char buf[64];

  fprintf(stream, "              EditRate: %u/%u\n", TDesc.EditRate.Numerator, TDesc.EditRate.Denominator);
  fprintf(stream, "     ContainerDuration: %u\n",    TDesc.ContainerDuration);
  fprintf(stream, "               AssetID: %s\n",    TmpID.EncodeHex(buf, 64));
  fprintf(stream, "         NamespaceName: %s\n",    TDesc.NamespaceName.c_str());
  fprintf(stream, "         ResourceCount: %zu\n",   TDesc.ResourceList.size());
  fprintf(stream, "RFC5646LanguageTagList: %s\n",    TDesc.RFC5646LanguageTagList.c_str());

  TimedText::ResourceList_t::const_iterator ri;
  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end(); ri++ )
    {
      TmpID.Set((*ri).ResourceID);
      fprintf(stream, "    %s: %s\n",
	      TmpID.EncodeHex(buf, 64), 
	      MIME2str((*ri).Type));
    }
}